

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O3

int poptBitsClr(poptBits bits)

{
  int iVar1;
  
  if (bits == (poptBits)0x0) {
    iVar1 = -0x14;
  }
  else {
    iVar1 = 0;
    memset(bits,0,(ulong)((_poptBitsM - 1 >> 5) * 4 + 4));
  }
  return iVar1;
}

Assistant:

int poptBitsClr(poptBits bits)
{
    static size_t nbw = (__PBM_NBITS/8);
    size_t nw = (__PBM_IX(_poptBitsM-1) + 1);

    if (bits == NULL)
	return POPT_ERROR_NULLARG;
    memset(bits, 0, nw * nbw);
    return 0;
}